

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

char * control_address(connectdata *conn)

{
  connectdata *conn_local;
  
  if ((((ulong)conn->bits >> 3 & 1) == 0) && (((ulong)conn->bits >> 1 & 1) == 0)) {
    conn_local = (connectdata *)&conn->primary;
  }
  else {
    conn_local = (connectdata *)(conn->host).name;
  }
  return (char *)conn_local;
}

Assistant:

static char *control_address(struct connectdata *conn)
{
  /* Returns the control connection IP address.
     If a proxy tunnel is used, returns the original hostname instead, because
     the effective control connection address is the proxy address,
     not the ftp host. */
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.tunnel_proxy || conn->bits.socksproxy)
    return conn->host.name;
#endif
  return conn->primary.remote_ip;
}